

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::changeColsCost(Highs *this,HighsInt *mask,double *cost)

{
  HighsStatus HVar1;
  allocator local_f1;
  string local_f0;
  HighsIndexCollection index_collection;
  HighsLogOptions local_80;
  
  clearDerivedModelProperties(this);
  index_collection.dimension_ = -1;
  index_collection.is_interval_ = false;
  index_collection.from_ = -1;
  index_collection.to_ = -2;
  index_collection.is_set_ = false;
  index_collection.set_num_entries_ = -1;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  index_collection._41_8_ = 0;
  create(&index_collection,mask,(this->model_).lp_.num_col_);
  HVar1 = changeCostsInterface(this,&index_collection,cost);
  HighsLogOptions::HighsLogOptions(&local_80,&(this->options_).super_HighsOptionsStruct.log_options)
  ;
  std::__cxx11::string::string((string *)&local_f0,"changeCosts",&local_f1);
  HVar1 = interpretCallStatus(&local_80,HVar1,kOk,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Function_base::~_Function_base(&local_80.user_callback.super__Function_base);
  if (HVar1 == kError) {
    HVar1 = kError;
  }
  else {
    HVar1 = returnFromHighs(this,HVar1);
  }
  HighsIndexCollection::~HighsIndexCollection(&index_collection);
  return HVar1;
}

Assistant:

HighsStatus Highs::changeColsCost(const HighsInt* mask, const double* cost) {
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, model_.lp_.num_col_);
  assert(!create_error);
  (void)create_error;
  HighsStatus call_status = changeCostsInterface(index_collection, cost);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeCosts");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}